

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::SelectNth
          (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *this,
          SubFrames *frames,idx_t n)

{
  size_type sVar1;
  value_type vVar2;
  ulong uVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var6;
  vector<unsigned_long,_true> *this_00;
  ulong uVar7;
  const_reference pvVar8;
  unsigned_long *puVar9;
  long lVar10;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var11;
  ulong uVar12;
  pair<unsigned_long,_unsigned_long> *ppVar13;
  pointer puVar14;
  const_iterator __begin3;
  pointer pFVar15;
  idx_t f;
  long lVar16;
  ulong uVar17;
  pointer puVar18;
  long lVar19;
  unsigned_long uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  pair<unsigned_long,_unsigned_long> pVar23;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  long local_a0;
  array<std::pair<unsigned_long,_unsigned_long>,_3UL> matches;
  array<std::pair<unsigned_long,_unsigned_long>,_3UL> cascades;
  
  uVar3 = ((long)(this->tree).
                 super_vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                 .
                 super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->tree).
                super_vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                .
                super__Vector_base<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  if (uVar3 < 2) {
    local_e0 = 0;
LAB_015d2a76:
    uVar17 = local_e0;
    uVar20 = 0;
  }
  else {
    uVar17 = uVar3 - 2;
    local_e8 = 1;
    uVar12 = uVar17;
    while (bVar21 = uVar12 != 0, uVar12 = uVar12 - 1, bVar21) {
      local_e8 = local_e8 << 5;
    }
    if (uVar17 < 3) {
      local_e0 = 0;
      local_f0 = n;
    }
    else {
      puVar9 = &cascades._M_elems[0].second;
      cascades._M_elems[2].first = 0;
      cascades._M_elems[2].second = 0;
      cascades._M_elems[1].first = 0;
      cascades._M_elems[1].second = 0;
      cascades._M_elems[0].first = 0;
      cascades._M_elems[0].second = 0;
      pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::get<true>(&this->tree,uVar3 - 1);
      for (uVar3 = 0;
          uVar3 < (ulong)((long)(frames->
                                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                ).
                                super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(frames->
                                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                ).
                                super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1)
      {
        pvVar5 = vector<duckdb::FrameBounds,_true>::get<true>(frames,uVar3);
        _Var6 = ::std::
                __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                          ((pvVar4->first).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (pvVar4->first).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish,pvVar5);
        puVar18 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ((pair<unsigned_long,_unsigned_long> *)(puVar9 + -1))->first =
             (long)_Var6._M_current - (long)puVar18 >> 3 & 0xffffffffffffffe0;
        _Var6 = ::std::
                __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                          (puVar18,(pvVar4->first).
                                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,&pvVar5->end);
        *puVar9 = (long)_Var6._M_current -
                  (long)(pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3 & 0xffffffffffffffe0;
        puVar9 = puVar9 + 2;
      }
      local_e0 = 0;
      for (; 1 < uVar17; uVar17 = uVar17 - 1) {
        pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::get<true>(&this->tree,uVar17 + 1);
        this_00 = &pvVar4->second;
        pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                 ::get<true>(&this->tree,uVar17);
        puVar18 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_f0 = n;
        while( true ) {
          matches._M_elems[2].first = 0;
          matches._M_elems[2].second = 0;
          matches._M_elems[1].first = 0;
          matches._M_elems[1].second = 0;
          matches._M_elems[0].first = 0;
          matches._M_elems[0].second = 0;
          lVar19 = 8;
          uVar12 = 0;
          for (uVar3 = 0;
              uVar7 = (long)(frames->
                            super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>)
                            .
                            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(frames->
                            super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>)
                            .
                            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4, uVar3 < uVar7;
              uVar3 = uVar3 + 1) {
            pvVar5 = vector<duckdb::FrameBounds,_true>::get<true>(frames,uVar3);
            sVar1 = *(size_type *)((long)&matches._M_elems[2].second + lVar19);
            pvVar8 = vector<unsigned_long,_true>::get<true>(this_00,sVar1);
            vVar2 = *pvVar8;
            pvVar8 = vector<unsigned_long,_true>::get<true>(this_00,sVar1 + 0x20);
            puVar9 = ::std::
                     __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar18 + vVar2,puVar18 + *pvVar8,pvVar5);
            lVar16 = (long)puVar9 - (long)puVar18 >> 3;
            *(long *)((long)matches._M_elems + lVar19 + -8) = lVar16;
            sVar1 = *(size_type *)((long)&cascades._M_elems[0].first + lVar19);
            pvVar8 = vector<unsigned_long,_true>::get<true>(this_00,sVar1);
            vVar2 = *pvVar8;
            local_a0 = lVar19;
            pvVar8 = vector<unsigned_long,_true>::get<true>(this_00,sVar1 + 0x20);
            lVar19 = local_a0;
            puVar9 = ::std::
                     __lower_bound<unsigned_long_const*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar18 + vVar2,puVar18 + *pvVar8,&pvVar5->end);
            lVar10 = (long)puVar9 - (long)puVar18 >> 3;
            *(long *)((long)&matches._M_elems[0].first + lVar19) = lVar10;
            uVar12 = (uVar12 - lVar16) + lVar10;
            lVar19 = lVar19 + 0x10;
          }
          if (local_f0 < uVar12) break;
          ppVar13 = cascades._M_elems;
          while (bVar21 = uVar7 != 0, uVar7 = uVar7 - 1, bVar21) {
            uVar20 = ppVar13->second;
            ((pair<unsigned_long,_unsigned_long> *)&ppVar13->first)->first =
                 ((pair<unsigned_long,_unsigned_long> *)&ppVar13->first)->first + 1;
            ppVar13->second = uVar20 + 1;
            ppVar13 = ppVar13 + 1;
          }
          local_e0 = local_e0 + 1;
          local_f0 = local_f0 - uVar12;
        }
        auVar22._8_4_ = (int)local_e0;
        auVar22._0_8_ = local_e0;
        auVar22._12_4_ = (int)(local_e0 >> 0x20);
        lVar19 = 0;
        while (bVar21 = uVar7 != 0, uVar7 = uVar7 - 1, bVar21) {
          uVar3 = *(ulong *)((long)&matches._M_elems[0].second + lVar19);
          *(ulong *)((long)&cascades._M_elems[0].first + lVar19) =
               (*(ulong *)((long)&matches._M_elems[0].first + lVar19) & 0xffffffffffffffe0) +
               local_e0 * 0x40;
          *(ulong *)((long)&cascades._M_elems[0].second + lVar19) =
               (uVar3 & 0xffffffffffffffe0) + auVar22._8_8_ * 0x40;
          lVar19 = lVar19 + 0x10;
        }
        local_e0 = local_e0 << 5;
        local_e8 = local_e8 >> 5;
        n = local_f0;
      }
      uVar17 = 1;
      local_f0 = n;
    }
    while (uVar17 != 0) {
      pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
               ::get<true>(&this->tree,uVar17);
      puVar18 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + local_e8 * local_e0;
      while (puVar14 = puVar18 + local_e8,
            puVar14 < (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
        uVar12 = 0;
        for (uVar3 = 0;
            uVar3 < (ulong)((long)(frames->
                                  super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                  ).
                                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(frames->
                                  super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                  ).
                                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4); uVar3 = uVar3 + 1
            ) {
          pvVar5 = vector<duckdb::FrameBounds,_true>::get<true>(frames,uVar3);
          _Var6 = ::std::
                  __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (puVar18,puVar14,pvVar5);
          _Var11 = ::std::
                   __lower_bound<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                             (_Var6._M_current,puVar14,&pvVar5->end);
          uVar12 = uVar12 + ((long)_Var11._M_current - (long)_Var6._M_current >> 3);
        }
        if (local_f0 < uVar12) break;
        local_e0 = local_e0 + 1;
        puVar18 = puVar14;
        local_f0 = local_f0 - uVar12;
      }
      local_e0 = local_e0 << 5;
      local_e8 = local_e8 >> 5;
      uVar17 = uVar17 - 1;
    }
    pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::get<true>(&this->tree,0);
    puVar18 = (pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar20 = local_f0 + 1;
    pvVar4 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
             ::get<true>(&this->tree,0);
    uVar3 = (long)(pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pvVar4->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (local_e0 + 0x20 < uVar3) {
      uVar3 = local_e0 + 0x20;
    }
    uVar17 = uVar3;
    if (uVar3 < local_e0) {
      uVar17 = local_e0;
    }
    for (; local_e0 < uVar3; local_e0 = local_e0 + 1) {
      uVar12 = puVar18[local_e0];
      for (pFVar15 = (frames->
                     super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                     super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pFVar15 !=
          (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
          super__Vector_impl_data._M_finish; pFVar15 = pFVar15 + 1) {
        uVar20 = uVar20 - (uVar12 < pFVar15->end && pFVar15->start <= uVar12);
      }
      if (uVar20 == 0) goto LAB_015d2a76;
    }
  }
  pVar23.second = uVar20;
  pVar23.first = uVar17;
  return pVar23;
}

Assistant:

pair<idx_t, idx_t> MergeSortTree<E, O, CMP, F, C>::SelectNth(const SubFrames &frames, idx_t n) const {
	// Handle special case of a one-element tree
	if (tree.size() < 2) {
		return {0, 0};
	}

	// 	The first level contains a single run,
	//	so the only thing we need is any cascading pointers
	auto level_no = tree.size() - 2;
	idx_t level_width = 1;
	for (idx_t i = 0; i < level_no; ++i) {
		level_width *= FANOUT;
	}

	// Find Nth element in a top-down traversal
	idx_t result = 0;

	// First, handle levels with cascading pointers
	const auto min_cascaded = LowestCascadingLevel();
	if (level_no > min_cascaded) {
		//	Initialise the cascade indicies from the previous level
		using CascadeRange = pair<idx_t, idx_t>;
		std::array<CascadeRange, 3> cascades;
		const auto &level = tree[level_no + 1].first;
		for (idx_t f = 0; f < frames.size(); ++f) {
			const auto &frame = frames[f];
			auto &cascade_idx = cascades[f];
			const auto lower_idx =
			    UnsafeNumericCast<idx_t>(std::lower_bound(level.begin(), level.end(), frame.start) - level.begin());
			cascade_idx.first = lower_idx / CASCADING * FANOUT;
			const auto upper_idx =
			    UnsafeNumericCast<idx_t>(std::lower_bound(level.begin(), level.end(), frame.end) - level.begin());
			cascade_idx.second = upper_idx / CASCADING * FANOUT;
		}

		// 	Walk the cascaded levels
		for (; level_no >= min_cascaded; --level_no) {
			//	The cascade indicies into this level are in the previous level
			const auto &level_cascades = tree[level_no + 1].second;

			// Go over all children until we found enough in range
			const auto *level_data = tree[level_no].first.data();
			while (true) {
				idx_t matched = 0;
				std::array<CascadeRange, 3> matches;
				for (idx_t f = 0; f < frames.size(); ++f) {
					const auto &frame = frames[f];
					auto &cascade_idx = cascades[f];
					auto &match = matches[f];

					const auto lower_begin = level_data + level_cascades[cascade_idx.first];
					const auto lower_end = level_data + level_cascades[cascade_idx.first + FANOUT];
					match.first =
					    UnsafeNumericCast<idx_t>(std::lower_bound(lower_begin, lower_end, frame.start) - level_data);

					const auto upper_begin = level_data + level_cascades[cascade_idx.second];
					const auto upper_end = level_data + level_cascades[cascade_idx.second + FANOUT];
					match.second =
					    UnsafeNumericCast<idx_t>(std::lower_bound(upper_begin, upper_end, frame.end) - level_data);

					matched += idx_t(match.second - match.first);
				}
				if (matched > n) {
					// 	Too much in this level, so move down to leftmost child candidate within the cascade range
					for (idx_t f = 0; f < frames.size(); ++f) {
						auto &cascade_idx = cascades[f];
						auto &match = matches[f];
						cascade_idx.first = (match.first / CASCADING + 2 * result) * FANOUT;
						cascade_idx.second = (match.second / CASCADING + 2 * result) * FANOUT;
					}
					break;
				}

				//	Not enough in this child, so move right
				for (idx_t f = 0; f < frames.size(); ++f) {
					auto &cascade_idx = cascades[f];
					++cascade_idx.first;
					++cascade_idx.second;
				}
				++result;
				n -= matched;
			}
			result *= FANOUT;
			level_width /= FANOUT;
		}
	}

	//	Continue with the uncascaded levels (except the first)
	for (; level_no > 0; --level_no) {
		const auto &level = tree[level_no].first;
		auto range_begin = level.begin() + UnsafeNumericCast<int64_t>(result * level_width);
		auto range_end = range_begin + UnsafeNumericCast<int64_t>(level_width);
		while (range_end < level.end()) {
			idx_t matched = 0;
			for (idx_t f = 0; f < frames.size(); ++f) {
				const auto &frame = frames[f];
				const auto lower_match = std::lower_bound(range_begin, range_end, frame.start);
				const auto upper_match = std::lower_bound(lower_match, range_end, frame.end);
				matched += idx_t(upper_match - lower_match);
			}
			if (matched > n) {
				// 	Too much in this level, so move down to leftmost child candidate
				//	Since we have no cascade pointers left, this is just the start of the next level.
				break;
			}
			//	Not enough in this child, so move right
			range_begin = range_end;
			range_end += UnsafeNumericCast<int64_t>(level_width);
			++result;
			n -= matched;
		}
		result *= FANOUT;
		level_width /= FANOUT;
	}

	// The last level
	const auto *level_data = tree[level_no].first.data();
	++n;

	const auto count = tree[level_no].first.size();
	for (const auto limit = MinValue<idx_t>(result + FANOUT, count); result < limit; ++result) {
		const auto v = level_data[result];
		for (const auto &frame : frames) {
			n -= (v >= frame.start) && (v < frame.end);
		}
		if (!n) {
			break;
		}
	}

	return {result, n};
}